

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

BinsSelectExpressionSyntax * __thiscall slang::parsing::Parser::parseBinsSelectPrimary(Parser *this)

{
  Token op_00;
  Token closeParen_00;
  Token openParen_00;
  Token openParen_01;
  Token with_00;
  Token closeParen_01;
  bool bVar1;
  ExpressionSyntax *expr_00;
  MatchesClauseSyntax *pMVar2;
  ParserBase *in_RDI;
  Token TVar3;
  Token TVar4;
  MatchesClauseSyntax *matches_1;
  Token closeParen_1;
  ExpressionSyntax *expr_2;
  Token openParen_1;
  Token with;
  MatchesClauseSyntax *matches;
  ExpressionSyntax *expr_1;
  Token closeParen;
  BinsSelectExpressionSyntax *expr;
  Token openParen;
  Token op;
  BinsSelectExpressionSyntax *result;
  anon_class_8_1_8991fb9c parseMatches;
  anon_class_8_1_8991fb9c parseCondition;
  int in_stack_0000015c;
  Parser *in_stack_00000160;
  bitmask<slang::parsing::detail::ExpressionOptions> in_stack_0000016c;
  ParserBase *in_stack_fffffffffffffea8;
  Parser *in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb8;
  TokenKind in_stack_fffffffffffffebe;
  ParserBase *in_stack_fffffffffffffec0;
  ParserBase *in_stack_fffffffffffffec8;
  Parser *in_stack_fffffffffffffef0;
  SyntaxFactory *local_e8;
  Info *local_e0;
  Info *local_d0;
  TokenKind kind;
  ParserBase *in_stack_ffffffffffffff40;
  bitmask<slang::parsing::detail::ExpressionOptions> local_a4;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff60;
  TokenKind local_30;
  BinSelectWithFilterExprSyntax *local_20;
  
  TVar3 = ParserBase::peek(in_stack_fffffffffffffea8);
  local_30 = TVar3.kind;
  if (local_30 == OpenParenthesis) {
    ParserBase::consume(in_RDI);
    parseBinsSelectExpression(in_stack_fffffffffffffef0);
    ParserBase::expect(in_stack_ffffffffffffff40,kind);
    openParen_01.info = (Info *)in_RDI;
    openParen_01._0_8_ = in_stack_fffffffffffffec8;
    closeParen_00.rawLen._2_2_ = in_stack_fffffffffffffebe;
    closeParen_00._0_6_ = in_stack_fffffffffffffeb8;
    closeParen_00.info = (Info *)in_stack_fffffffffffffec0;
    local_20 = (BinSelectWithFilterExprSyntax *)
               slang::syntax::SyntaxFactory::parenthesizedBinsSelectExpr
                         ((SyntaxFactory *)in_stack_fffffffffffffeb0,openParen_01,
                          (BinsSelectExpressionSyntax *)in_stack_fffffffffffffea8,closeParen_00);
  }
  else if (local_30 == Exclamation) {
    ParserBase::consume(in_RDI);
    in_stack_fffffffffffffec8 = in_RDI + 1;
    parseBinsSelectPrimary::anon_class_8_1_8991fb9c::operator()(in_stack_ffffffffffffff60);
    op_00.rawLen._2_2_ = in_stack_fffffffffffffebe;
    op_00._0_6_ = in_stack_fffffffffffffeb8;
    op_00.info = (Info *)in_stack_fffffffffffffec0;
    local_20 = (BinSelectWithFilterExprSyntax *)
               slang::syntax::SyntaxFactory::unaryBinsSelectExpr
                         ((SyntaxFactory *)in_stack_fffffffffffffeb0,op_00,
                          (BinsSelectConditionExprSyntax *)in_stack_fffffffffffffea8);
  }
  else if (local_30 == BinsOfKeyword) {
    local_20 = (BinSelectWithFilterExprSyntax *)
               parseBinsSelectPrimary::anon_class_8_1_8991fb9c::operator()
                         (in_stack_ffffffffffffff60);
  }
  else {
    bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_a4,BinsSelectContext);
    parseSubExpression(in_stack_00000160,in_stack_0000016c,in_stack_0000015c);
    parseBinsSelectPrimary::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffef0);
    local_20 = (BinSelectWithFilterExprSyntax *)
               slang::syntax::SyntaxFactory::simpleBinsSelectExpr
                         ((SyntaxFactory *)in_stack_fffffffffffffeb0,
                          (ExpressionSyntax *)in_stack_fffffffffffffea8,
                          (MatchesClauseSyntax *)0xc1a157);
  }
  bVar1 = ParserBase::peek(in_stack_fffffffffffffec0,in_stack_fffffffffffffebe);
  if (bVar1) {
    TVar3 = ParserBase::consume(in_RDI);
    TVar4 = ParserBase::expect(TVar3._0_8_,kind);
    expr_00 = parseExpression(in_stack_fffffffffffffeb0);
    kind = TVar4.info._6_2_;
    TVar3 = ParserBase::expect(TVar3._0_8_,kind);
    pMVar2 = parseBinsSelectPrimary::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffffef0);
    local_d0 = TVar4._0_8_;
    local_e8 = TVar3._0_8_;
    local_e0 = TVar3.info;
    with_00.info = (Info *)in_RDI;
    with_00._0_8_ = in_stack_fffffffffffffec8;
    openParen_00.info = (Info *)pMVar2;
    openParen_00._0_8_ = local_e0;
    closeParen_01.info = local_d0;
    closeParen_01._0_8_ = local_e0;
    local_20 = slang::syntax::SyntaxFactory::binSelectWithFilterExpr
                         (local_e8,(BinsSelectExpressionSyntax *)expr_00,with_00,openParen_00,
                          (ExpressionSyntax *)local_e8,closeParen_01,
                          (MatchesClauseSyntax *)TVar4.info);
  }
  return &local_20->super_BinsSelectExpressionSyntax;
}

Assistant:

BinsSelectExpressionSyntax& Parser::parseBinsSelectPrimary() {
    auto parseCondition = [&]() -> BinsSelectConditionExprSyntax& {
        auto binsof = expect(TokenKind::BinsOfKeyword);
        auto openParen = expect(TokenKind::OpenParenthesis);
        auto& name = parseName();
        auto closeParen = expect(TokenKind::CloseParenthesis);

        IntersectClauseSyntax* intersectClause = nullptr;
        if (peek(TokenKind::IntersectKeyword)) {
            auto intersect = consume();
            auto& ranges = parseRangeList();
            intersectClause = &factory.intersectClause(intersect, ranges);
        }

        return factory.binsSelectConditionExpr(binsof, openParen, name, closeParen,
                                               intersectClause);
    };

    auto parseMatches = [&] {
        MatchesClauseSyntax* matchesClause = nullptr;
        if (peek(TokenKind::MatchesKeyword)) {
            auto matches = consume();
            auto& matchExpr = parseSubExpression(ExpressionOptions::BinsSelectContext, 0);
            matchesClause = &factory.matchesClause(matches, factory.expressionPattern(matchExpr));
        }
        return matchesClause;
    };

    BinsSelectExpressionSyntax* result;
    switch (peek().kind) {
        case TokenKind::BinsOfKeyword:
            result = &parseCondition();
            break;
        case TokenKind::Exclamation: {
            auto op = consume();
            result = &factory.unaryBinsSelectExpr(op, parseCondition());
            break;
        }
        case TokenKind::OpenParenthesis: {
            auto openParen = consume();
            auto& expr = parseBinsSelectExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            result = &factory.parenthesizedBinsSelectExpr(openParen, expr, closeParen);
            break;
        }
        default: {
            auto& expr = parseSubExpression(ExpressionOptions::BinsSelectContext, 0);
            auto matches = parseMatches();
            result = &factory.simpleBinsSelectExpr(expr, matches);
            break;
        }
    }

    if (peek(TokenKind::WithKeyword)) {
        auto with = consume();
        auto openParen = expect(TokenKind::OpenParenthesis);
        auto& expr = parseExpression();
        auto closeParen = expect(TokenKind::CloseParenthesis);
        auto matches = parseMatches();
        result = &factory.binSelectWithFilterExpr(*result, with, openParen, expr, closeParen,
                                                  matches);
    }

    return *result;
}